

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::JsonReporter::testCaseStarting(JsonReporter *this,TestCaseInfo *tcInfo)

{
  StringRef *pSVar1;
  StringRef value;
  _Elt_pointer pJVar2;
  Tag *tag;
  StringRef *value_00;
  StringRef key;
  JsonObjectWriter testInfo;
  StringRef local_218;
  JsonArrayWriter local_208;
  JsonObjectWriter local_1f0;
  JsonArrayWriter local_1d8;
  undefined1 local_1c0 [400];
  uint64_t local_30;
  
  (this->super_StreamingReporterBase).currentTestCaseInfo = tcInfo;
  startObject(this);
  pJVar2 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar2 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar2 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)local_1c0,(int)pJVar2 + -0x18,"test-info",9);
  local_1f0.m_os = (ostream *)local_1c0._0_8_;
  local_1f0.m_indent_level = local_30;
  local_1f0.m_should_comma = false;
  local_1f0.m_active = true;
  local_218.m_start._0_1_ = 0x7b;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0._0_8_,(char *)&local_218,1);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1c0,(int)&local_1f0,"name",4);
  value.m_start = (tcInfo->name)._M_dataplus._M_p;
  value.m_size = (tcInfo->name)._M_string_length;
  JsonValueWriter::writeImpl((JsonValueWriter *)local_1c0,value,true);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x88));
  anon_unknown_26::writeSourceInfo(&local_1f0,&tcInfo->lineInfo);
  JsonObjectWriter::write((JsonObjectWriter *)local_1c0,(int)&local_1f0,"tags",4);
  local_1d8.m_os = (ostream *)local_1c0._0_8_;
  local_1d8.m_indent_level = local_30;
  local_1d8.m_should_comma = false;
  local_1d8.m_active = true;
  local_218.m_start = (char *)CONCAT71(local_218.m_start._1_7_,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0._0_8_,(char *)&local_218,1);
  value_00 = &((tcInfo->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
               super__Vector_impl_data._M_start)->original;
  pSVar1 = &((tcInfo->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
             super__Vector_impl_data._M_finish)->original;
  if (value_00 != pSVar1) {
    do {
      JsonArrayWriter::writeImpl<Catch::StringRef>(&local_1d8,value_00);
      value_00 = value_00 + 1;
    } while (value_00 != pSVar1);
  }
  JsonArrayWriter::~JsonArrayWriter(&local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1c0,(int)&local_1f0,"properties",10);
  local_208.m_os = (ostream *)local_1c0._0_8_;
  local_208.m_indent_level = local_30;
  local_208.m_should_comma = false;
  local_208.m_active = true;
  local_218.m_start = (char *)CONCAT71(local_218.m_start._1_7_,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0._0_8_,(char *)&local_218,1);
  if ((tcInfo->properties & IsHidden) != None) {
    local_218.m_start = "is-hidden";
    local_218.m_size = 9;
    JsonArrayWriter::writeImpl<Catch::StringRef>(&local_208,&local_218);
  }
  if ((tcInfo->properties & (MayFail|ShouldFail)) != None) {
    local_218.m_start = "ok-to-fail";
    local_218.m_size = 10;
    JsonArrayWriter::writeImpl<Catch::StringRef>(&local_208,&local_218);
  }
  if ((tcInfo->properties & ShouldFail) != None) {
    local_218.m_start = "expected-to-fail";
    local_218.m_size = 0x10;
    JsonArrayWriter::writeImpl<Catch::StringRef>(&local_208,&local_218);
  }
  if ((tcInfo->properties & Throws) != None) {
    local_218.m_start = "throws";
    local_218.m_size = 6;
    JsonArrayWriter::writeImpl<Catch::StringRef>(&local_208,&local_218);
  }
  JsonArrayWriter::~JsonArrayWriter(&local_208);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x88));
  JsonObjectWriter::~JsonObjectWriter(&local_1f0);
  key.m_size = 4;
  key.m_start = "runs";
  startArray(this,key);
  return;
}

Assistant:

void JsonReporter::testCaseStarting( TestCaseInfo const& tcInfo ) {
        StreamingReporterBase::testCaseStarting( tcInfo );

        assert( isInside( Writer::Array ) &&
                "We should be in the 'test-cases' array" );
        startObject();
        // "test-info" prelude
        {
            auto testInfo =
                m_objectWriters.top().write( "test-info"_sr ).writeObject();
            // TODO: handle testName vs className!!
            testInfo.write( "name"_sr ).write( tcInfo.name );
            writeSourceInfo(testInfo, tcInfo.lineInfo);
            writeTags( testInfo.write( "tags"_sr ).writeArray(), tcInfo.tags );
            writeProperties( testInfo.write( "properties"_sr ).writeArray(),
                             tcInfo );
        }


        // Start the array for individual test runs (testCasePartial pairs)
        startArray( "runs"_sr );
    }